

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::SystemInformationImplementation::FindManufacturer
          (SystemInformationImplementation *this,string *family)

{
  string *psVar1;
  int iVar2;
  Manufacturer MVar3;
  long *local_40 [2];
  long local_30 [2];
  
  psVar1 = &(this->ChipID).Vendor;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    MVar3 = Intel;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      MVar3 = UMC;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      MVar3 = AMD;
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        MVar3 = AMD;
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar2 == 0) {
            MVar3 = Hygon;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar2 == 0) {
              MVar3 = Cyrix;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar2 == 0) {
                MVar3 = NexGen;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar2 == 0) {
                  MVar3 = IDT;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)psVar1);
                  if (iVar2 == 0) {
                    MVar3 = Rise;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)psVar1);
                    MVar3 = Transmeta;
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)psVar1);
                      if (iVar2 != 0) {
                        iVar2 = std::__cxx11::string::compare((char *)psVar1);
                        if (iVar2 == 0) {
                          MVar3 = NSC;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)psVar1);
                          if (iVar2 == 0) {
                            MVar3 = Sun;
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)psVar1);
                            if (iVar2 == 0) {
                              MVar3 = IBM;
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)psVar1);
                              if (iVar2 == 0) {
                                MVar3 = HP;
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((char *)psVar1);
                                if (iVar2 == 0) {
                                  MVar3 = Motorola;
                                }
                                else {
                                  std::__cxx11::string::substr((ulong)local_40,(ulong)family);
                                  iVar2 = std::__cxx11::string::compare((char *)local_40);
                                  if (local_40[0] != local_30) {
                                    operator_delete(local_40[0],local_30[0] + 1);
                                  }
                                  MVar3 = (uint)(iVar2 != 0) * 2 + HP;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->ChipManufacturer = MVar3;
  return;
}

Assistant:

void SystemInformationImplementation::FindManufacturer(
  const std::string& family)
{
  if (this->ChipID.Vendor == "GenuineIntel")
    this->ChipManufacturer = Intel; // Intel Corp.
  else if (this->ChipID.Vendor == "UMC UMC UMC ")
    this->ChipManufacturer = UMC; // United Microelectronics Corp.
  else if (this->ChipID.Vendor == "AuthenticAMD")
    this->ChipManufacturer = AMD; // Advanced Micro Devices
  else if (this->ChipID.Vendor == "AMD ISBETTER")
    this->ChipManufacturer = AMD; // Advanced Micro Devices (1994)
  else if (this->ChipID.Vendor == "HygonGenuine")
    this->ChipManufacturer = Hygon; // Chengdu Haiguang IC Design Co., Ltd.
  else if (this->ChipID.Vendor == "CyrixInstead")
    this->ChipManufacturer = Cyrix; // Cyrix Corp., VIA Inc.
  else if (this->ChipID.Vendor == "NexGenDriven")
    this->ChipManufacturer = NexGen; // NexGen Inc. (now AMD)
  else if (this->ChipID.Vendor == "CentaurHauls")
    this->ChipManufacturer = IDT; // IDT/Centaur (now VIA)
  else if (this->ChipID.Vendor == "RiseRiseRise")
    this->ChipManufacturer = Rise; // Rise
  else if (this->ChipID.Vendor == "GenuineTMx86")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "TransmetaCPU")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "Geode By NSC")
    this->ChipManufacturer = NSC; // National Semiconductor
  else if (this->ChipID.Vendor == "Sun")
    this->ChipManufacturer = Sun; // Sun Microelectronics
  else if (this->ChipID.Vendor == "IBM")
    this->ChipManufacturer = IBM; // IBM Microelectronics
  else if (this->ChipID.Vendor == "Hewlett-Packard")
    this->ChipManufacturer = HP; // Hewlett-Packard
  else if (this->ChipID.Vendor == "Motorola")
    this->ChipManufacturer = Motorola; // Motorola Microelectronics
  else if (family.substr(0, 7) == "PA-RISC")
    this->ChipManufacturer = HP; // Hewlett-Packard
  else
    this->ChipManufacturer = UnknownManufacturer; // Unknown manufacturer
}